

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O0

void mk_plugin_exit_all(mk_server *server)

{
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_list *tmp;
  mk_list *head;
  mk_plugin *plugin;
  mk_server *server_local;
  
  for (tmp = (server->plugins).next; tmp != &server->plugins; tmp = tmp->next) {
    (*(code *)tmp[-4].prev)(&tmp[-8].next);
  }
  tmp = (server->plugins).next;
  __mptr = tmp->next;
  while (tmp != &server->plugins) {
    mk_list_del(tmp);
    mk_plugin_exit_stages((mk_plugin *)&tmp[-8].next);
    if (*(int *)&tmp[2].prev == 1) {
      mk_mem_free(tmp[-1].prev);
      dlclose(tmp[-2].next);
    }
    else if (*(int *)&tmp[2].prev == 0) {
      if (tmp[-3].next != (mk_list *)0x0) {
        mk_mem_free(tmp[-3].next);
      }
      mk_mem_free(&tmp[-8].next);
    }
    tmp = __mptr;
    __mptr = __mptr->next;
  }
  mk_mem_free(server->api);
  mk_mem_free(plg_stagemap);
  return;
}

Assistant:

void mk_plugin_exit_all(struct mk_server *server)
{
    struct mk_plugin *plugin;
    struct mk_list *head, *tmp;

    /* Plugins */
    mk_list_foreach(head, &server->plugins) {
        plugin = mk_list_entry(head, struct mk_plugin, _head);
        plugin->exit_plugin(plugin);
    }

    /* Plugin interface it self */
    mk_list_foreach_safe(head, tmp, &server->plugins) {
        plugin = mk_list_entry(head, struct mk_plugin, _head);
        mk_list_del(&plugin->_head);
        mk_plugin_exit_stages(plugin);

        if (plugin->load_type == MK_PLUGIN_DYNAMIC) {
            mk_mem_free(plugin->path);
#ifdef _WIN32
            FreeLibrary((HMODULE)plugin->handler);
#else
            dlclose(plugin ->handler);
#endif
        }
        else if (plugin->load_type == MK_PLUGIN_STATIC) {
            if (plugin->network != NULL) {
                mk_mem_free(plugin->network);
            }

            mk_mem_free(plugin);
        }
    }

    mk_mem_free(server->api);
    mk_mem_free(plg_stagemap);
}